

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<false>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<false>>
           *this,undefined8 *state,long *next)

{
  undefined8 uVar1;
  char cVar2;
  uint uVar3;
  
  uVar1 = *state;
  uVar3 = 0xffffffff;
  do {
    if (*(uint *)(this + 8) <= uVar3 + 1) goto LAB_001245b5;
    cVar2 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
    uVar3 = uVar3 + 1;
  } while (cVar2 != '\0');
LAB_001245c9:
  *state = uVar1;
  return false;
LAB_001245b5:
  do {
    cVar2 = (**(code **)(*next + 0x10))(next,state);
    if (cVar2 != '\0') {
      return true;
    }
    uVar3 = uVar3 + 1;
  } while ((uVar3 < *(uint *)(this + 0xc)) &&
          (cVar2 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state), cVar2 != '\0'));
  goto LAB_001245c9;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, non_greedy_tag) const
        {
            BOOST_ASSERT(!this->leading_);
            BidiIter const tmp = state.cur_;
            unsigned int matches = 0;

            for(; matches < this->min_; ++matches)
            {
                if(!this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            do
            {
                if(next.match(state))
                {
                    return true;
                }
            }
            while(matches++ < this->max_ && this->xpr_.match(state));

            state.cur_ = tmp;
            return false;
        }